

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::GetFreeEntry(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
               *this)

{
  HeapAllocator *pHVar1;
  TrackAllocData local_40;
  EntryType *local_18;
  EntryType *retFree;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *this_local;
  
  local_18 = this->free;
  if (local_18 == (EntryType *)0x0) {
    pHVar1 = this->allocator;
    retFree = (EntryType *)this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&SimpleHashEntry<Js::JavascriptPromise*,int>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
               ,0x14a);
    pHVar1 = Memory::HeapAllocator::TrackAllocInfo(pHVar1,&local_40);
    local_18 = (EntryType *)new<Memory::HeapAllocator>(0x18,pHVar1,0x350bd0);
  }
  else {
    this->free = local_18->next;
    this->freecount = this->freecount - 1;
  }
  return local_18;
}

Assistant:

EntryType* GetFreeEntry()
    {
        EntryType* retFree = free;
        if (nullptr == retFree )
        {
            retFree = AllocatorNewStruct(TAllocator, allocator, EntryType);
        }
        else
        {
            free = retFree->next;
            freecount--;
        }
        return retFree;
    }